

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

NeuralNetwork * __thiscall
CoreML::Specification::BranchLayerParams::mutable_elsebranch(BranchLayerParams *this)

{
  NeuralNetwork *this_00;
  BranchLayerParams *this_local;
  
  if (this->elsebranch_ == (NeuralNetwork *)0x0) {
    this_00 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(this_00);
    this->elsebranch_ = this_00;
  }
  return this->elsebranch_;
}

Assistant:

inline ::CoreML::Specification::NeuralNetwork* BranchLayerParams::mutable_elsebranch() {
  
  if (elsebranch_ == NULL) {
    elsebranch_ = new ::CoreML::Specification::NeuralNetwork;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.BranchLayerParams.elseBranch)
  return elsebranch_;
}